

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall
ON_BoundingBox::Intersection(ON_BoundingBox *this,ON_Line *line,double *t0,double *t1)

{
  double *pdVar1;
  bool bVar2;
  double dVar3;
  int local_84;
  int i;
  double *to;
  double *from;
  double *boxmax;
  double *boxmin;
  ON_Interval Li;
  ON_Interval ti;
  ON_Interval t;
  double *t1_local;
  double *t0_local;
  ON_Line *line_local;
  ON_BoundingBox *this_local;
  
  ON_Interval::ON_Interval((ON_Interval *)(ti.m_t + 1),-1.79769313486232e+308,1.79769313486232e+308)
  ;
  ON_Interval::ON_Interval((ON_Interval *)(Li.m_t + 1));
  ON_Interval::ON_Interval((ON_Interval *)&boxmin);
  local_84 = 0;
  do {
    if (2 < local_84) {
      if (t0 != (double *)0x0) {
        dVar3 = ON_Interval::Min((ON_Interval *)(ti.m_t + 1));
        *t0 = dVar3;
      }
      if (t1 != (double *)0x0) {
        dVar3 = ON_Interval::Max((ON_Interval *)(ti.m_t + 1));
        *t1 = dVar3;
      }
      return true;
    }
    dVar3 = (&(line->from).x)[local_84];
    pdVar1 = &(line->to).x + local_84;
    if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
      boxmin = (double *)(&(line->from).x)[local_84];
      Li.m_t[0] = (&(line->to).x)[local_84];
      Li.m_t[1] = ON_Interval::NormalizedParameterAt
                            ((ON_Interval *)&boxmin,(&(this->m_min).x)[local_84]);
      ti.m_t[0] = ON_Interval::NormalizedParameterAt
                            ((ON_Interval *)&boxmin,(&(this->m_max).x)[local_84]);
      bVar2 = ON_Interval::Intersection((ON_Interval *)(ti.m_t + 1),(ON_Interval *)(Li.m_t + 1));
      if (!bVar2) {
        return false;
      }
    }
    else if (((&(line->from).x)[local_84] < (&(this->m_min).x)[local_84]) ||
            (dVar3 = (&(line->from).x)[local_84], pdVar1 = &(this->m_max).x + local_84,
            *pdVar1 <= dVar3 && dVar3 != *pdVar1)) {
      return false;
    }
    local_84 = local_84 + 1;
  } while( true );
}

Assistant:

bool ON_BoundingBox::Intersection(				//Returns true when intersect is non-empty. 
				 const ON_Line& line,		//Infinite Line segment to intersect with 
				 double* t0 ,			// t0  parameter of first intersection point
				 double* t1       // t1  parameter of last intersection point (t0<=t1)   
				 ) const
{		 
	ON_Interval t(-ON_DBL_MAX, ON_DBL_MAX), ti, Li;
  const double* boxmin = &m_min.x;
  const double* boxmax = &m_max.x;
  const double* from   = &line.from.x;
  const double* to     = &line.to.x;
	for(int i=0; i<3; i++)
  {
		if( from[i] == to[i] )
    {
			if( from[i] < boxmin[i] || from[i] > boxmax[i] )
				return false;
		} 
    else 
    {
      Li.m_t[0] = from[i];
      Li.m_t[1] = to[i];
			ti.m_t[0] = Li.NormalizedParameterAt( boxmin[i]); 
			ti.m_t[1] = Li.NormalizedParameterAt( boxmax[i]);
			if ( !t.Intersection(ti) )
        return false;
		}
	}	

	if(t0)
		*t0 = t.Min();
	if(t1)
		*t1 = t.Max();
	return true;
}